

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void __thiscall
MPLSParser::composePlayItem
          (MPLSParser *this,BitStreamWriter *writer,size_t playItemNum,
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          *pmtIndexList)

{
  uint *puVar1;
  pointer pmVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int i_1;
  int i;
  long lVar11;
  string clip_Information_file_name;
  int local_74;
  string local_70;
  string local_50;
  
  puVar1 = (writer->super_BitStream).m_initBuffer;
  iVar10 = (*(int *)&(writer->super_BitStream).m_buffer - (int)puVar1) * 8 + writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x10,0);
  iVar6 = *(int *)&(writer->super_BitStream).m_buffer -
          *(int *)&(writer->super_BitStream).m_initBuffer;
  iVar7 = writer->m_bitWrited + iVar6 * 8;
  iVar6 = writer->m_bitWrited + iVar6 * 8 + 7;
  if (-1 < iVar7) {
    iVar6 = iVar7;
  }
  local_74 = ((int)playItemNum << (this->isDependStreamExist & 0x1fU)) + this->m_m2tsOffset;
  int32ToStr_abi_cxx11_(&local_50,&local_74);
  strPadLeft(&local_70,&local_50,5,'0');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_p = local_70._M_dataplus._M_p;
  lVar11 = 0;
  do {
    BitStreamWriter::putBits(writer,8,(int)_Var3._M_p[lVar11]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  lVar11 = 0;
  do {
    BitStreamWriter::putBits(writer,8,(int)"M2TS"[lVar11]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  BitStreamWriter::putBits(writer,0xb,0);
  BitStreamWriter::putBits(writer,1,0);
  BitStreamWriter::putBits(writer,4,(uint)(playItemNum != 0) * 5 + 1);
  BitStreamWriter::putBits(writer,8,(uint)this->ref_to_STC_id);
  if (playItemNum != 0) {
    pmVar2 = (pmtIndexList->
             super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*(size_t *)((long)&pmVar2[playItemNum - 1]._M_t._M_impl.super__Rb_tree_header + 0x20) != 0)
    {
      BitStreamWriter::putBits
                (writer,0x20,
                 (*(_Base_ptr *)
                   ((long)&pmVar2[playItemNum]._M_t._M_impl.super__Rb_tree_header + 0x10))[1].
                 _M_color >> 1);
      goto LAB_001e6441;
    }
  }
  BitStreamWriter::putBits(writer,0x20,this->IN_time);
LAB_001e6441:
  pmVar2 = (pmtIndexList->
           super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((((long)(pmtIndexList->
              super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar2 >> 4) * -0x5555555555555555
       - 1U == playItemNum) ||
     (*(size_t *)((long)&pmVar2[playItemNum + 1]._M_t._M_impl.super__Rb_tree_header + 0x20) == 0)) {
    BitStreamWriter::putBits(writer,0x20,this->OUT_time);
  }
  else {
    BitStreamWriter::putBits
              (writer,0x20,
               (uint)(*(ulong *)(*(_Base_ptr *)
                                  ((long)&pmVar2[playItemNum + 1]._M_t._M_impl.super__Rb_tree_header
                                  + 0x10) + 1) >> 1));
  }
  BitStreamWriter::putBits(writer,0x1c,0);
  bVar4 = isV3();
  uVar9 = 0xf;
  if (!bVar4) {
    uVar9 = 0;
  }
  BitStreamWriter::putBits(writer,4,uVar9);
  BitStreamWriter::putBits(writer,1,0);
  bVar4 = isV3();
  BitStreamWriter::putBits(writer,1,(uint)bVar4);
  BitStreamWriter::putBits(writer,0x1e,0);
  BitStreamWriter::putBits(writer,1,(uint)this->PlayItem_random_access_flag);
  BitStreamWriter::putBits(writer,7,0);
  BitStreamWriter::putBits(writer,8,0);
  BitStreamWriter::putBits(writer,0x10,0);
  composeSTN_table(this,writer,playItemNum,false);
  iVar7 = *(int *)&(writer->super_BitStream).m_buffer -
          *(int *)&(writer->super_BitStream).m_initBuffer;
  uVar9 = writer->m_bitWrited + iVar7 * 8;
  uVar8 = writer->m_bitWrited + iVar7 * 8 + 7;
  if (-1 < (int)uVar9) {
    uVar8 = uVar9;
  }
  uVar5 = my_ntohs((short)(uVar8 >> 3) - (short)(iVar6 >> 3));
  iVar7 = iVar10 + 7;
  if (-1 < iVar10) {
    iVar7 = iVar10;
  }
  *(uint16_t *)((long)puVar1 + (long)(iVar7 >> 3)) = uVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MPLSParser::composePlayItem(BitStreamWriter& writer, const size_t playItemNum,
                                 const std::vector<PMTIndex>& pmtIndexList)
{
    const auto lengthPos = reinterpret_cast<uint16_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(16, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;
    int fileNum = static_cast<int>(playItemNum);
    if (isDependStreamExist)
        fileNum *= 2;
    const std::string clip_Information_file_name = strPadLeft(int32ToStr(fileNum + m_m2tsOffset), 5u, '0');
    CLPIStreamInfo::writeString(clip_Information_file_name.c_str(), writer, 5);
    constexpr char clip_codec_identifier[] = "M2TS";
    CLPIStreamInfo::writeString(clip_codec_identifier, writer, 4);
    writer.putBits(11, 0);  // reserved_for_future_use
    writer.putBit(0);       // is_multi_angle
    const int connection_condition = playItemNum == 0 ? 1 : 6;
    writer.putBits(4, connection_condition);
    writer.putBits(8, ref_to_STC_id);

    if (playItemNum != 0 && !pmtIndexList[playItemNum - 1].empty())
        writer.putBits(32, static_cast<unsigned>(pmtIndexList[playItemNum].begin()->first) / 2);
    else
        writer.putBits(32, IN_time);

    if (playItemNum != pmtIndexList.size() - 1 && !pmtIndexList[playItemNum + 1].empty())
        writer.putBits(32, static_cast<unsigned>(pmtIndexList[playItemNum + 1].begin()->first / 2));
    else
        writer.putBits(32, OUT_time);

    writer.putBits(28, 0);               // UO_mask_table;
    writer.putBits(4, isV3() ? 15 : 0);  // UO_mask_table;
    writer.putBit(0);                    // reserved
    writer.putBit(isV3() ? 1 : 0);       // UO_mask_table: SecondaryPGStreamNumberChange
    writer.putBits(30, 0);               // UO_mask_table cont;

    writer.putBit(PlayItem_random_access_flag);
    writer.putBits(7, 0);   // reserved_for_future_use
    writer.putBits(8, 0);   // still_mode
    writer.putBits(16, 0);  // reserved after stillMode != 0x01
    composeSTN_table(writer, playItemNum, false);
    *lengthPos = my_htons(static_cast<uint16_t>(writer.getBitsCount() / 8 - beforeCount));
}